

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O3

void __thiscall arangodb::velocypack::Parser::ParsedNumber::addDigit(ParsedNumber *this,int i)

{
  ulong uVar1;
  Exception *this_00;
  double dVar2;
  undefined1 auVar3 [16];
  
  if (this->isInteger == false) {
    dVar2 = this->doubleValue;
  }
  else {
    uVar1 = this->intValue;
    if ((uVar1 < 0x1999999999999999) || (i < 0x36 && uVar1 == 0x1999999999999999)) {
      this->intValue = ((long)i + uVar1 * 10) - 0x30;
      return;
    }
    auVar3._8_4_ = (int)(uVar1 >> 0x20);
    auVar3._0_8_ = uVar1;
    auVar3._12_4_ = 0x45300000;
    dVar2 = ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0) +
            (auVar3._8_8_ - 1.9342813113834067e+25);
    this->isInteger = false;
  }
  dVar2 = dVar2 * 10.0 + (double)(i + -0x30);
  this->doubleValue = dVar2;
  if ((long)ABS(dVar2) < 0x7ff0000000000000) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,NumberOutOfRange);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void addDigit(int i) {
      if (isInteger) {
        // check if adding another digit to the int will make it overflow
        if (intValue < 1844674407370955161ULL ||
            (intValue == 1844674407370955161ULL && (i - '0') <= 5)) {
          // int won't overflow
          intValue = intValue * 10 + (i - '0');
          return;
        }
        // int would overflow
        doubleValue = static_cast<double>(intValue);
        isInteger = false;
      }

      doubleValue = doubleValue * 10.0 + (i - '0');
      if (std::isnan(doubleValue) || !std::isfinite(doubleValue)) {
        throw Exception(Exception::NumberOutOfRange);
      }
    }